

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O1

void __thiscall xray_re::xr_scene_lights::xr_scene_lights(xr_scene_lights *this,xr_scene *scene)

{
  xr_token_vec *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  xr_token local_48;
  
  xr_scene_objects::xr_scene_objects
            (&this->super_xr_scene_objects,scene,"light.part",SCENE_CHUNK_LIGHTS);
  (this->super_xr_scene_objects).super_xr_scene_part._vptr_xr_scene_part =
       (_func_int **)&PTR__xr_scene_lights_00249b28;
  this->m_flags = 0;
  this_00 = &this->m_controls;
  (this->m_controls).super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_controls).super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_controls).super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_sun).field_0 = (anon_union_8_3_f28016de_for__vector2<float>_1)0x40a31565bedf66f3;
  paVar1 = &local_48.name.field_2;
  local_48.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"$static","");
  local_48.id = 0;
  std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::
  emplace_back<xray_re::xr_token>(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.name._M_dataplus._M_p,local_48.name.field_2._M_allocated_capacity + 1);
  }
  local_48.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"$hemi","");
  local_48.id = 1;
  std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::
  emplace_back<xray_re::xr_token>(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.name._M_dataplus._M_p,local_48.name.field_2._M_allocated_capacity + 1);
  }
  local_48.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"$sun","");
  local_48.id = 2;
  std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::
  emplace_back<xray_re::xr_token>(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.name._M_dataplus._M_p,local_48.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

xr_scene_lights::xr_scene_lights(xr_scene& scene):
	xr_scene_objects(scene, "light.part", SCENE_CHUNK_LIGHTS),
	m_flags(0)
{
	m_sun.set(deg2rad(-25.f), deg2rad(292.f));
	m_controls.push_back(xr_token("$static", 0));
	m_controls.push_back(xr_token("$hemi", 1));
	m_controls.push_back(xr_token("$sun", 2));
}